

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Pseudo * add_instruction_operand(Proc *proc,Instruction *insn,Pseudo *pseudo)

{
  Pseudo *local_28;
  Pseudo *to_free;
  Pseudo *pseudo_local;
  Instruction *insn_local;
  Proc *proc_local;
  
  local_28 = (Pseudo *)0x0;
  to_free = pseudo;
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    local_28 = indexed_load(proc,pseudo);
    to_free = local_28;
  }
  raviX_ptrlist_add((PtrList **)&insn->operands,to_free,proc->linearizer->compiler_state->allocator)
  ;
  return local_28;
}

Assistant:

static inline Pseudo *add_instruction_operand(Proc *proc, Instruction *insn, Pseudo *pseudo)
{
	Pseudo *to_free = NULL;
	if (pseudo->type == PSEUDO_INDEXED) {
		pseudo = indexed_load(proc, pseudo);
		to_free = pseudo;
	}
	raviX_ptrlist_add((PtrList **)&insn->operands, pseudo, proc->linearizer->compiler_state->allocator);
	return to_free;
}